

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 ExtractToken(char **pzIn,char *zEnd,char *zMask,int nMasklen,SyString *pOut)

{
  byte *pbVar1;
  byte *pbVar2;
  int i;
  ulong uVar3;
  bool bVar4;
  
  pbVar2 = (byte *)*pzIn;
  bVar4 = pbVar2 < zEnd;
  if (bVar4) {
    do {
      if ((nMasklen < 1) || (0xbf < *pbVar2)) {
LAB_0013790f:
        pbVar1 = pbVar2;
        if (!bVar4) {
          return -0x12;
        }
        for (; pbVar1 < zEnd; pbVar1 = pbVar1 + 1) {
          if ((*pbVar1 < 0xc0) && (0 < nMasklen)) {
            uVar3 = 0;
            do {
              if (zMask[uVar3] == *pbVar1) goto LAB_00137962;
              uVar3 = uVar3 + 1;
            } while ((uint)nMasklen != uVar3);
          }
        }
LAB_00137962:
        pOut->zString = (char *)pbVar2;
        pOut->nByte = (int)pbVar1 - (int)pbVar2;
        *pzIn = (char *)pbVar1;
        return 0;
      }
      uVar3 = 0;
      while (zMask[uVar3] != *pbVar2) {
        uVar3 = uVar3 + 1;
        if ((uint)nMasklen == uVar3) goto LAB_0013790f;
      }
      pbVar2 = pbVar2 + 1;
      bVar4 = pbVar2 < zEnd;
    } while (pbVar2 != (byte *)zEnd);
  }
  return -0x12;
}

Assistant:

static sxi32 ExtractToken(const char **pzIn, const char *zEnd, const char *zMask, int nMasklen, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading delimiter */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && CheckMask(zIn[0], zMask, nMasklen, 0) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd ){
		if( (unsigned char)zIn[0] >= 0xc0 ){
			/* UTF-8 stream */
			zIn++;
			SX_JMP_UTF8(zIn, zEnd);
		}else{
			if( CheckMask(zIn[0], zMask, nMasklen, 0) ){
				break;
			}
			zIn++;
		}
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Update the cursor */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}